

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O3

string * __thiscall
enact::AstSerialise::visitReferenceExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,ReferenceExpr *expr)

{
  pointer pcVar1;
  Expr *pEVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  ulong *local_110;
  long local_108;
  ulong local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_70[0] = local_60;
  if ((expr->permission).super__Optional_base<enact::Token,_false,_false>._M_payload.
      super__Optional_payload<enact::Token,_true,_false,_false>.
      super__Optional_payload_base<enact::Token>._M_engaged == true) {
    pcVar1 = (expr->permission).super__Optional_base<enact::Token,_false,_false>._M_payload.
             super__Optional_payload<enact::Token,_true,_false,_false>.
             super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar1,
               pcVar1 + (expr->permission).super__Optional_base<enact::Token,_false,_false>.
                        _M_payload.super__Optional_payload<enact::Token,_true,_false,_false>.
                        super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme.
                        _M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>();
  }
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x11d35d);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_40 = *plVar6;
    lStack_38 = plVar4[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar6;
    local_50 = (long *)*plVar4;
  }
  local_48 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_100 = *puVar7;
    uStack_f8 = (undefined4)plVar4[3];
    uStack_f4 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar7;
    local_110 = (ulong *)*plVar4;
  }
  local_108 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_130 = local_120;
  if ((expr->region).super__Optional_base<enact::Token,_false,_false>._M_payload.
      super__Optional_payload<enact::Token,_true,_false,_false>.
      super__Optional_payload_base<enact::Token>._M_engaged == true) {
    pcVar1 = (expr->region).super__Optional_base<enact::Token,_false,_false>._M_payload.
             super__Optional_payload<enact::Token,_true,_false,_false>.
             super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar1,
               pcVar1 + (expr->region).super__Optional_base<enact::Token,_false,_false>._M_payload.
                        super__Optional_payload<enact::Token,_true,_false,_false>.
                        super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme.
                        _M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  }
  uVar9 = 0xf;
  if (local_110 != &local_100) {
    uVar9 = local_100;
  }
  if (uVar9 < (ulong)(local_128 + local_108)) {
    uVar9 = 0xf;
    if (local_130 != local_120) {
      uVar9 = local_120[0];
    }
    if (uVar9 < (ulong)(local_128 + local_108)) goto LAB_0011abec;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0011abec:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_130);
  }
  local_f0 = &local_e0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_e0 = *plVar4;
    uStack_d8 = puVar5[3];
  }
  else {
    local_e0 = *plVar4;
    local_f0 = (long *)*puVar5;
  }
  local_e8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_a0 = *puVar7;
    uStack_98 = (undefined4)plVar4[3];
    uStack_94 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar7;
    local_b0 = (ulong *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pEVar2 = (expr->expr)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar2->_vptr_Expr[2])(&local_90,pEVar2,&this->field_0x8);
  uVar9 = 0xf;
  if (local_b0 != &local_a0) {
    uVar9 = local_a0;
  }
  if (uVar9 < (ulong)(local_88 + local_a8)) {
    uVar9 = 0xf;
    if (local_90 != local_80) {
      uVar9 = local_80[0];
    }
    if ((ulong)(local_88 + local_a8) <= uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
      goto LAB_0011ad44;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
LAB_0011ad44:
  local_d0 = &local_c0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_c0 = *plVar4;
    uStack_b8 = puVar5[3];
  }
  else {
    local_c0 = *plVar4;
    local_d0 = (long *)*puVar5;
  }
  local_c8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar8) {
    lVar3 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitReferenceExpr(ReferenceExpr &expr) {
        return "(&" +
                (expr.permission ? expr.permission->lexeme : "") + " " +
                (expr.region ? expr.region->lexeme : "") + " " +
                visitExpr(*expr.expr) + ")";
    }